

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatCommon.h
# Opt level: O1

void __thiscall llvm::FmtAlign::format(FmtAlign *this,raw_ostream *S,StringRef Options)

{
  size_t __n;
  void *__buf;
  int __fd;
  uint32_t Count;
  ulong uVar1;
  SmallString<64U> Item;
  raw_svector_ostream Stream;
  undefined1 *local_b0;
  ulong local_a8;
  undefined1 local_a0 [64];
  raw_ostream local_60;
  undefined1 **local_38;
  
  __n = Options.Length;
  if (this->Amount == 0) {
    (**(code **)(*(long *)this->Adapter + 0x10))(this->Adapter,S,Options.Data,__n);
    return;
  }
  local_b0 = local_a0;
  local_a8 = 0x4000000000;
  local_60.BufferMode = InternalBuffer;
  local_60.OutBufStart = (char *)0x0;
  local_60.OutBufEnd = (char *)0x0;
  local_60.OutBufCur = (char *)0x0;
  local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_001e81c0;
  local_38 = &local_b0;
  raw_ostream::SetUnbuffered(&local_60);
  (**(code **)(*(long *)this->Adapter + 0x10))(this->Adapter,&local_60,Options.Data);
  __buf = (void *)(local_a8 & 0xffffffff);
  uVar1 = (long)this->Amount - (long)__buf;
  __fd = (int)local_b0;
  if ((void *)this->Amount < __buf || uVar1 == 0) {
LAB_00172008:
    raw_ostream::write(S,__fd,__buf,__n);
  }
  else {
    if (this->Where == Center) {
      Count = (uint32_t)(uVar1 >> 1);
      fill(this,S,Count);
      raw_ostream::write(S,(int)local_b0,(void *)(local_a8 & 0xffffffff),__n);
      uVar1 = (ulong)((uint32_t)uVar1 - Count);
    }
    else {
      if (this->Where != Left) {
        fill(this,S,(uint32_t)uVar1);
        __fd = (int)local_b0;
        __buf = (void *)(local_a8 & 0xffffffff);
        goto LAB_00172008;
      }
      raw_ostream::write(S,__fd,__buf,__n);
    }
    fill(this,S,(uint32_t)uVar1);
  }
  raw_ostream::~raw_ostream(&local_60);
  if (local_b0 != local_a0) {
    free(local_b0);
  }
  return;
}

Assistant:

void format(raw_ostream &S, StringRef Options) {
    // If we don't need to align, we can format straight into the underlying
    // stream.  Otherwise we have to go through an intermediate stream first
    // in order to calculate how long the output is so we can align it.
    // TODO: Make the format method return the number of bytes written, that
    // way we can also skip the intermediate stream for left-aligned output.
    if (Amount == 0) {
      Adapter.format(S, Options);
      return;
    }
    SmallString<64> Item;
    raw_svector_ostream Stream(Item);

    Adapter.format(Stream, Options);
    if (Amount <= Item.size()) {
      S << Item;
      return;
    }

    size_t PadAmount = Amount - Item.size();
    switch (Where) {
    case AlignStyle::Left:
      S << Item;
      fill(S, PadAmount);
      break;
    case AlignStyle::Center: {
      size_t X = PadAmount / 2;
      fill(S, X);
      S << Item;
      fill(S, PadAmount - X);
      break;
    }
    default:
      fill(S, PadAmount);
      S << Item;
      break;
    }
  }